

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>::Data
          (Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *this,
          Data<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_> *other)

{
  Span *pSVar1;
  Entry *pEVar2;
  Data *pDVar3;
  storage_type_conflict *psVar4;
  ulong uVar5;
  Node<QStringView,_QXmlStreamReaderPrivate::Entity> *pNVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  R_conflict26 RVar10;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar8 = other->numBuckets;
  sVar9 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar9;
  this->spans = (Span *)0x0;
  RVar10 = allocateSpans(sVar8);
  this->spans = RVar10.spans;
  if (RVar10.nSpans != 0) {
    lVar7 = 0;
    sVar8 = 0;
    do {
      pSVar1 = other->spans;
      sVar9 = 0;
      do {
        uVar5 = (ulong)pSVar1->offsets[sVar9 + lVar7];
        if (uVar5 != 0xff) {
          pEVar2 = pSVar1[sVar8].entries;
          pNVar6 = Span<QHashPrivate::Node<QStringView,_QXmlStreamReaderPrivate::Entity>_>::insert
                             (this->spans + sVar8,sVar9);
          psVar4 = *(storage_type_conflict **)(pEVar2[uVar5].storage.data + 8);
          (pNVar6->key).m_size = *(qsizetype *)pEVar2[uVar5].storage.data;
          (pNVar6->key).m_data = psVar4;
          pDVar3 = *(Data **)(pEVar2[uVar5].storage.data + 0x10);
          (pNVar6->value).name.d.d = pDVar3;
          (pNVar6->value).name.d.ptr = *(char16_t **)(pEVar2[uVar5].storage.data + 0x18);
          (pNVar6->value).name.d.size = *(qsizetype *)(pEVar2[uVar5].storage.data + 0x20);
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type_conflict)
                  (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
            UNLOCK();
          }
          pDVar3 = *(Data **)(pEVar2[uVar5].storage.data + 0x28);
          (pNVar6->value).value.d.d = pDVar3;
          (pNVar6->value).value.d.ptr = *(char16_t **)(pEVar2[uVar5].storage.data + 0x30);
          (pNVar6->value).value.d.size = *(qsizetype *)(pEVar2[uVar5].storage.data + 0x38);
          if (pDVar3 != (Data *)0x0) {
            LOCK();
            (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          (pNVar6->value).field_0x30 = pEVar2[uVar5].storage.data[0x40];
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != 0x80);
      sVar8 = sVar8 + 1;
      lVar7 = lVar7 + 0x90;
    } while (sVar8 != RVar10.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }